

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O2

Literals * __thiscall
wasm::ShellExternalInterface::callTable
          (Literals *__return_storage_ptr__,ShellExternalInterface *this,Name tableName,
          Address index,HeapType sig,Literals *arguments,Type results,ModuleRunner *instance)

{
  HeapType *this_00;
  Module *this_01;
  string_view name;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar1;
  bool bVar2;
  iterator iVar3;
  long lVar4;
  Function *pFVar5;
  size_t sVar6;
  Type *pTVar7;
  long lVar8;
  array<wasm::Literal,_1UL> *paVar9;
  undefined1 this_02 [8];
  Name name_00;
  Signature SVar10;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar11;
  SmallVector<wasm::Literal,_1UL> local_b8;
  undefined1 local_80 [8];
  Name tableName_local;
  undefined1 local_48 [8];
  Iterator __begin2;
  
  tableName_local.super_IString.str._M_len = tableName.super_IString.str._M_str;
  local_80 = tableName.super_IString.str._M_len;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = (size_t)this;
  iVar3 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->tables)._M_h,(key_type *)local_80);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callTable on non-existing table");
  }
  lVar8 = *(long *)((long)iVar3.
                          super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
                          ._M_cur + 0x18);
  lVar4 = *(long *)((long)iVar3.
                          super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
                          ._M_cur + 0x20) - lVar8;
  if ((ulong)(lVar4 / 0x18) <= index.addr) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callTable overflow",lVar4 % 0x18);
    lVar8 = *(long *)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
                            ._M_cur + 0x18);
  }
  lVar4 = index.addr * 0x18;
  bVar2 = wasm::Type::isFunction((Type *)(lVar8 + lVar4 + 0x10));
  if ((bVar2) &&
     (bVar2 = wasm::Type::isNull((Type *)(*(long *)((long)iVar3.
                                                  super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
                                                  ._M_cur + 0x18) + lVar4 + 0x10)), !bVar2)) {
    this_01 = (instance->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm;
    name_00 = Literal::getFunc((Literal *)
                               (lVar4 + *(long *)((long)iVar3.
                                                  super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_true>
                                                  ._M_cur + 0x18)));
    pFVar5 = Module::getFunctionOrNull(this_01,name_00);
    if (pFVar5 != (Function *)0x0) goto LAB_00d4574b;
  }
  (**(code **)(*(long *)__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index + 0x40))
            (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
             "uninitialized table element");
  pFVar5 = (Function *)0x0;
LAB_00d4574b:
  this_00 = &pFVar5->type;
  if ((pFVar5->type).id != sig.id) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callIndirect: function types don\'t match");
  }
  SVar10 = HeapType::getSignature(this_00);
  local_48 = (undefined1  [8])SVar10.params.id;
  sVar6 = wasm::Type::size((Type *)local_48);
  lVar8 = (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (sVar6 != lVar8 / 0x18 + (arguments->super_SmallVector<wasm::Literal,_1UL>).usedFixed) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callIndirect: bad # of arguments",lVar8 % 0x18);
  }
  SVar10 = HeapType::getSignature(this_00);
  tableName_local.super_IString.str._M_str = (char *)SVar10.params.id;
  this_02 = (undefined1  [8])&tableName_local.super_IString.str._M_str;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_48 = this_02;
  PVar11 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
           wasm::Type::end((Type *)this_02);
  lVar8 = -0x18;
  lVar4 = 0;
  pTVar7 = (Type *)0x0;
  while (PVar1.index = (size_t)pTVar7, PVar1.parent = (Type *)this_02, PVar11 != PVar1) {
    pTVar7 = wasm::Type::Iterator::operator*((Iterator *)local_48);
    bVar2 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    paVar9 = (array<wasm::Literal,_1UL> *)
             ((long)&((arguments->super_SmallVector<wasm::Literal,_1UL>).flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start)->field_0 + lVar8);
    if (bVar2) {
      paVar9 = &(arguments->super_SmallVector<wasm::Literal,_1UL>).fixed;
    }
    bVar2 = wasm::Type::isSubType((Type)paVar9->_M_elems[0].type.id,(Type)pTVar7->id);
    if (!bVar2) {
      (**(code **)(*(long *)__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index + 0x40))
                (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
                 "callIndirect: bad argument type");
    }
    lVar8 = lVar8 + 0x18;
    pTVar7 = (Type *)((long)&(__begin2.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
    this_02 = local_48;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar7;
  }
  SVar10 = HeapType::getSignature(this_00);
  if (SVar10.results.id.id != results.id) {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x40))
              (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               "callIndirect: bad result type");
  }
  if ((pFVar5->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    name = (pFVar5->super_Importable).super_Named.name.super_IString.str;
    SmallVector<wasm::Literal,_1UL>::SmallVector
              (&local_b8,&arguments->super_SmallVector<wasm::Literal,_1UL>);
    ModuleRunnerBase<wasm::ModuleRunner>::callFunction
              (__return_storage_ptr__,&instance->super_ModuleRunnerBase<wasm::ModuleRunner>,
               (Name)name,(Literals *)&local_b8);
    SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_b8);
  }
  else {
    (**(code **)(*(long *)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                + 0x20))
              (__return_storage_ptr__,
               __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               pFVar5,arguments);
  }
  return __return_storage_ptr__;
}

Assistant:

Literals callTable(Name tableName,
                     Address index,
                     HeapType sig,
                     Literals& arguments,
                     Type results,
                     ModuleRunner& instance) override {

    auto it = tables.find(tableName);
    if (it == tables.end()) {
      trap("callTable on non-existing table");
    }

    auto& table = it->second;
    if (index >= table.size()) {
      trap("callTable overflow");
    }
    Function* func = nullptr;
    if (table[index].isFunction() && !table[index].isNull()) {
      func = instance.wasm.getFunctionOrNull(table[index].getFunc());
    }
    if (!func) {
      trap("uninitialized table element");
    }
    if (sig != func->type) {
      trap("callIndirect: function types don't match");
    }
    if (func->getParams().size() != arguments.size()) {
      trap("callIndirect: bad # of arguments");
    }
    size_t i = 0;
    for (const auto& param : func->getParams()) {
      if (!Type::isSubType(arguments[i++].type, param)) {
        trap("callIndirect: bad argument type");
      }
    }
    if (func->getResults() != results) {
      trap("callIndirect: bad result type");
    }
    if (func->imported()) {
      return callImport(func, arguments);
    } else {
      return instance.callFunction(func->name, arguments);
    }
  }